

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O2

void * funchook_resolve_func(funchook_t *funchook,void *func)

{
  ulong *puVar1;
  int *piVar2;
  ulong uVar3;
  code *pcVar4;
  ulong uVar5;
  void *pvVar6;
  ulong *puVar7;
  ulong *puVar8;
  uint *puVar9;
  uint *puVar10;
  
  pcVar4 = mmap;
  puVar8 = (ulong *)0x0;
  while (puVar1 = *(ulong **)pcVar4, puVar1 != (ulong *)0x0) {
    puVar7 = puVar8;
    if ((((void *)*puVar1 <= func) && (puVar7 = puVar1, puVar8 != (ulong *)0x0)) &&
       (puVar7 = puVar8, (void *)*puVar1 < (void *)*puVar8)) {
      puVar7 = puVar1;
    }
    puVar8 = puVar7;
    pcVar4 = (code *)(puVar1 + 3);
  }
  if (puVar8 != (ulong *)0x0) {
    piVar2 = (int *)*puVar8;
    if (piVar2 == (int *)0x0) {
LAB_001025ff:
      puVar9 = (uint *)0x0;
      funchook_log(funchook,"  link_map addr=%p, name=%s\n",piVar2,puVar8[1]);
      puVar8 = (ulong *)(puVar8[2] + 8);
      puVar10 = (uint *)0x0;
      uVar5 = 0;
      do {
        uVar3 = puVar8[-1];
        if (uVar3 == 5) {
          puVar10 = (uint *)*puVar8;
        }
        else if (uVar3 == 6) {
          puVar9 = (uint *)*puVar8;
        }
        else if (uVar3 == 10) {
          uVar5 = *puVar8;
        }
        else if (uVar3 == 0) {
          while( true ) {
            if (puVar10 <= puVar9) {
              return func;
            }
            if (uVar5 <= *puVar9) break;
            if ((((puVar9[1] & 0xf) == 2) && (*(long *)(puVar9 + 4) == 0)) &&
               (*(void **)(puVar9 + 2) == func)) {
              pvVar6 = (void *)dlsym(0,(ulong)*puVar9 + (long)puVar10);
              if (pvVar6 == func) {
                pvVar6 = (void *)dlsym(0xffffffffffffffff,(ulong)*puVar9 + (long)puVar10);
              }
              if (pvVar6 == (void *)0x0) {
                return func;
              }
              funchook_log(funchook,"  change %s address from %p to %p\n",
                           (long)puVar10 + (ulong)*puVar9,func,pvVar6);
              return pvVar6;
            }
            puVar9 = puVar9 + 6;
          }
          return func;
        }
        puVar8 = puVar8 + 2;
      } while( true );
    }
    if (*piVar2 == 0x464c457f) {
      if ((*(ushort *)(piVar2 + 4) & 0xfffe) == 2) goto LAB_001025ff;
      funchook_log(funchook,"  ELF type is neither ET_EXEC nor ET_DYN.\n");
    }
    else {
      funchook_log(funchook,"  not a valid ELF module %s.\n",puVar8[1]);
    }
  }
  return func;
}

Assistant:

void *funchook_resolve_func(funchook_t *funchook, void *func)
{
#ifdef __GLIBC__
    struct link_map *lmap, *lm;
    const ElfW(Ehdr) *ehdr;
    const ElfW(Dyn) *dyn;
    const ElfW(Sym) *symtab = NULL;
    const ElfW(Sym) *symtab_end = NULL;
    const char *strtab = NULL;
    size_t strtab_size = 0;
    int i;

    lmap = NULL;
    for (lm = _r_debug.r_map; lm != NULL; lm = lm->l_next) {
        if ((void*)lm->l_addr <= func) {
            if (lmap == NULL) {
                lmap = lm;
            } else if (lmap->l_addr > lm->l_addr) {
                lmap = lm;
            }
        }
    }
    if (lmap == NULL) {
        return func;
    }
    if (lmap->l_addr != 0) {
        ehdr = (ElfW(Ehdr) *)lmap->l_addr;
        if (memcmp(ehdr->e_ident, ELFMAG, SELFMAG) != 0) {
            funchook_log(funchook, "  not a valid ELF module %s.\n", lmap->l_name);
            return func;
        }
        if (ehdr->e_type != ET_EXEC && ehdr->e_type != ET_DYN) {
          funchook_log(funchook, "  ELF type is neither ET_EXEC nor ET_DYN.\n");
          return func;
        }
    }
    funchook_log(funchook, "  link_map addr=%p, name=%s\n", (void*)lmap->l_addr, lmap->l_name);
    dyn = lmap->l_ld;

    for (i = 0; dyn[i].d_tag != DT_NULL; i++) {
        switch (dyn[i].d_tag) {
        case DT_SYMTAB:
            symtab = (const ElfW(Sym) *)dyn[i].d_un.d_ptr;
            break;
        case DT_STRTAB:
            strtab = (const char *)dyn[i].d_un.d_ptr;
            break;
        case DT_STRSZ:
            strtab_size = dyn[i].d_un.d_val;
            break;
        }
    }
    symtab_end = (const ElfW(Sym) *)strtab;
    while (symtab < symtab_end) {
        if (symtab->st_name >= strtab_size) {
            break;
        }
        if (ELF64_ST_TYPE(symtab->st_info) == STT_FUNC &&
            symtab->st_size == 0 && (void*)symtab->st_value == func) {
            void *fn = dlsym(RTLD_DEFAULT, strtab + symtab->st_name);
            if (fn == func) {
                fn = dlsym(RTLD_NEXT, strtab + symtab->st_name);
            }
            if (fn != NULL) {
                funchook_log(funchook, "  change %s address from %p to %p\n",
                             strtab + symtab->st_name, func, fn);
                func = fn;
            }
            break;
        }
        symtab++;
    }
#endif
    return func;
}